

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.h
# Opt level: O0

void __thiscall
Generic_Command_As_Console_Command<DeselectGenericCommand>::trigger
          (Generic_Command_As_Console_Command<DeselectGenericCommand> *this,string_view parameters)

{
  bool bVar1;
  pointer pRVar2;
  ostream *this_00;
  ostream *local_58;
  ostream *out_stream;
  unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  local_28;
  unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  response_line;
  Generic_Command_As_Console_Command<DeselectGenericCommand> *this_local;
  string_view parameters_local;
  
  response_line._M_t.
  super___uniq_ptr_impl<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  .super__Head_base<0UL,_Jupiter::GenericCommand::ResponseLine_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>,_true,_true>
        )(__uniq_ptr_data<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>,_true,_true>
          )this;
  pRVar2 = (pointer)(**(code **)(DeselectGenericCommand_instance.super_DeselectGenericCommand._0_8_
                                + 0x18))
                              (&DeselectGenericCommand_instance,parameters._M_len,parameters._M_str)
  ;
  std::
  unique_ptr<Jupiter::GenericCommand::ResponseLine,std::default_delete<Jupiter::GenericCommand::ResponseLine>>
  ::unique_ptr<std::default_delete<Jupiter::GenericCommand::ResponseLine>,void>
            ((unique_ptr<Jupiter::GenericCommand::ResponseLine,std::default_delete<Jupiter::GenericCommand::ResponseLine>>
              *)&local_28,pRVar2);
  do {
    bVar1 = std::operator==(&local_28,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
      ::~unique_ptr(&local_28);
      return;
    }
    pRVar2 = std::
             unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
             ::operator->(&local_28);
    if (*(int *)(pRVar2 + 0x20) == 2) {
LAB_0011c3d2:
      local_58 = (ostream *)&std::cerr;
    }
    else {
      pRVar2 = std::
               unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
               ::operator->(&local_28);
      if (*(int *)(pRVar2 + 0x20) == 3) goto LAB_0011c3d2;
      local_58 = (ostream *)&std::cout;
    }
    pRVar2 = std::
             unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
             ::operator->(&local_28);
    this_00 = std::operator<<(local_58,(string *)pRVar2);
    std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    pRVar2 = std::
             unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
             ::operator->(&local_28);
    std::
    unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
    ::reset(&local_28,*(pointer *)(pRVar2 + 0x28));
  } while( true );
}

Assistant:

void Generic_Command_As_Console_Command<T>::trigger(std::string_view parameters) {
	std::unique_ptr<Jupiter::GenericCommand::ResponseLine> response_line{ T::instance.trigger(parameters) };
	while (response_line != nullptr) {
		auto& out_stream = response_line->type == Jupiter::GenericCommand::DisplayType::PublicError
			|| response_line->type == Jupiter::GenericCommand::DisplayType::PrivateError ? std::cerr : std::cout;

		out_stream << response_line->response << std::endl;
		response_line.reset(response_line->next);
	}
}